

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O1

RK_S32 mpp_service_ioctl(RK_S32 fd,RK_U32 cmd,RK_U32 size,void *param)

{
  int iVar1;
  MppReqV1 mpp_req;
  ulong local_18;
  ulong uStack_10;
  void *local_8;
  
  local_18 = (ulong)cmd;
  uStack_10 = (ulong)size;
  local_8 = param;
  iVar1 = ioctl(fd,0x40047601,&local_18);
  return iVar1;
}

Assistant:

RK_S32 mpp_service_ioctl(RK_S32 fd, RK_U32 cmd, RK_U32 size, void *param)
{
    MppReqV1 mpp_req;

    memset(&mpp_req, 0, sizeof(mpp_req));

    mpp_req.cmd = cmd;
    mpp_req.flag = 0;
    mpp_req.size = size;
    mpp_req.offset = 0;
    mpp_req.data_ptr = REQ_DATA_PTR(param);

    return (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &mpp_req);
}